

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::callers
          (FuncVec *__return_storage_ptr__,LazyLLVMCallGraph *this,Function *F)

{
  pointer *pppFVar1;
  long *plVar2;
  iterator __position;
  _Base_ptr p_Var3;
  _Base_ptr *pp_Var4;
  long *plVar5;
  _Base_ptr p_Var6;
  vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getCallsOf(&local_38,this,F);
  if (local_38.super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  p_Var3 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &(this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (*(Function **)(p_Var3 + 1) >= F) {
      p_Var6 = p_Var3;
    }
    p_Var3 = (&p_Var3->_M_left)[*(Function **)(p_Var3 + 1) < F];
  } while (p_Var3 != (_Base_ptr)0x0);
  pp_Var4 = (_Base_ptr *)0x0;
  if (*(Function **)(p_Var6 + 1) <= F) {
    pp_Var4 = &p_Var6[1]._M_parent;
  }
  plVar2 = (long *)pp_Var4[5];
  for (plVar5 = (long *)pp_Var4[4]; plVar5 != plVar2; plVar5 = plVar5 + 1) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      _M_realloc_insert<llvm::Function_const*const&>
                ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                 __return_storage_ptr__,__position,(Function **)(*plVar5 + 0x38));
    }
    else {
      *__position._M_current = *(Function **)(*plVar5 + 0x38);
      pppFVar1 = &(__return_storage_ptr__->
                  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callers(const llvm::Function *F) override {
        FuncVec ret;
        // make sure we have the callers
        // (this will find also caller functions)
        getCallsOf(F);

        auto fnd = _cg.get(F);
        assert(fnd);
        for (auto *nd : fnd->getCallers()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }